

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pick.cpp
# Opt level: O1

size_t polyscope::pick::requestPickBufferRange(Structure *requestingStructure,size_t count)

{
  ulong uVar1;
  string local_60;
  tuple<unsigned_long,_unsigned_long,_polyscope::Structure_*> local_40;
  
  if (CARRY8(nextPickBufferInd,count)) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "Wow, you sure do have a lot of stuff, Polyscope can\'t even count it all. (Ran out of indices while enumerating structure elements for pick buffer.)"
               ,"");
    error(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  uVar1 = nextPickBufferInd;
  local_40.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_polyscope::Structure_*>.
  super__Tuple_impl<1UL,_unsigned_long,_polyscope::Structure_*>.
  super__Head_base<1UL,_unsigned_long,_false>._M_head_impl = count + nextPickBufferInd;
  local_40.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_polyscope::Structure_*>.
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = nextPickBufferInd;
  nextPickBufferInd =
       local_40.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_polyscope::Structure_*>.
       super__Tuple_impl<1UL,_unsigned_long,_polyscope::Structure_*>.
       super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
  local_40.super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_polyscope::Structure_*>.
  super__Tuple_impl<1UL,_unsigned_long,_polyscope::Structure_*>.
  super__Tuple_impl<2UL,_polyscope::Structure_*>.
  super__Head_base<2UL,_polyscope::Structure_*,_false>._M_head_impl =
       (_Head_base<2UL,_polyscope::Structure_*,_false>)
       (_Head_base<2UL,_polyscope::Structure_*,_false>)requestingStructure;
  std::
  vector<std::tuple<unsigned_long,unsigned_long,polyscope::Structure*>,std::allocator<std::tuple<unsigned_long,unsigned_long,polyscope::Structure*>>>
  ::emplace_back<std::tuple<unsigned_long,unsigned_long,polyscope::Structure*>>
            ((vector<std::tuple<unsigned_long,unsigned_long,polyscope::Structure*>,std::allocator<std::tuple<unsigned_long,unsigned_long,polyscope::Structure*>>>
              *)&structureRanges,&local_40);
  return uVar1;
}

Assistant:

size_t requestPickBufferRange(Structure* requestingStructure, size_t count) {

  // Check if we can satisfy the request
  size_t maxPickInd = std::numeric_limits<size_t>::max();
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wshift-count-overflow"
  if (bitsForPickPacking < 22) {
    uint64_t bitMax = 1ULL << (bitsForPickPacking * 3);
    if (bitMax < maxPickInd) {
      maxPickInd = bitMax;
    }
  }
#pragma GCC diagnostic pop

  if (count > maxPickInd || maxPickInd - count < nextPickBufferInd) {
    error("Wow, you sure do have a lot of stuff, Polyscope can't even count it all. (Ran out of indices while "
          "enumerating structure elements for pick buffer.)");
  }

  size_t ret = nextPickBufferInd;
  nextPickBufferInd += count;
  structureRanges.push_back(std::make_tuple(ret, nextPickBufferInd, requestingStructure));
  return ret;
}